

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode Curl_GetFTPResponse(ssize_t *nreadp,connectdata *conn,int *ftpcode)

{
  SessionHandle *data_00;
  int iVar1;
  uint *puVar2;
  int local_70;
  int local_6c;
  int value_to_be_ignored;
  int cache_skip;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  SessionHandle *pSStack_48;
  CURLcode result;
  SessionHandle *data;
  long interval_ms;
  long timeout;
  int *piStack_28;
  curl_socket_t sockfd;
  int *ftpcode_local;
  connectdata *conn_local;
  ssize_t *nreadp_local;
  
  timeout._4_4_ = conn->sock[0];
  pSStack_48 = conn->data;
  ftpc._4_4_ = CURLE_OK;
  nread = (size_t)&conn->proto;
  local_6c = 0;
  local_70 = 0;
  if (ftpcode == (int *)0x0) {
    piStack_28 = &local_70;
  }
  else {
    *ftpcode = 0;
    piStack_28 = ftpcode;
  }
  *nreadp = 0;
  pp = (pingpong *)nread;
  ftpcode_local = (int *)conn;
  conn_local = (connectdata *)nreadp;
  do {
    while( true ) {
      if (*piStack_28 != 0 || ftpc._4_4_ != CURLE_OK) goto LAB_008a47be;
      interval_ms = Curl_pp_state_timeout((pingpong *)nread);
      if (interval_ms < 1) {
        Curl_failf(pSStack_48,"FTP response timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      data = (SessionHandle *)0x3e8;
      if (interval_ms < 1000) {
        data = (SessionHandle *)interval_ms;
      }
      if ((*(long *)nread == 0) || (1 < local_6c)) break;
LAB_008a4769:
      ftpc._4_4_ = ftp_readresp(timeout._4_4_,(pingpong *)nread,piStack_28,
                                (size_t *)&value_to_be_ignored);
      if (ftpc._4_4_ != CURLE_OK) {
LAB_008a47be:
        *(undefined1 *)(nread + 0x20) = 0;
        return ftpc._4_4_;
      }
      if ((_value_to_be_ignored == 0) && (*(long *)nread != 0)) {
        local_6c = local_6c + 1;
      }
      else {
        local_6c = 0;
      }
      conn_local->data =
           (SessionHandle *)((long)conn_local->data->sockets + (_value_to_be_ignored - 0x38));
    }
    iVar1 = Curl_socket_check(timeout._4_4_,-1,-1,(long)data);
    data_00 = pSStack_48;
    if (iVar1 == -1) {
      puVar2 = (uint *)__errno_location();
      Curl_failf(data_00,"FTP response aborted due to select/poll error: %d",(ulong)*puVar2);
      return CURLE_RECV_ERROR;
    }
    if (iVar1 != 0) goto LAB_008a4769;
    iVar1 = Curl_pgrsUpdate((connectdata *)ftpcode_local);
    if (iVar1 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_GetFTPResponse(ssize_t *nreadp, /* return number of bytes read */
                             struct connectdata *conn,
                             int *ftpcode) /* return the ftp-code */
{
  /*
   * We cannot read just one byte per read() and then go back to select() as
   * the OpenSSL read() doesn't grok that properly.
   *
   * Alas, read as much as possible, split up into lines, use the ending
   * line in a response or continue reading.  */

  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  long timeout;              /* timeout in milliseconds */
  long interval_ms;
  struct SessionHandle *data = conn->data;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  size_t nread;
  int cache_skip=0;
  int value_to_be_ignored=0;

  if(ftpcode)
    *ftpcode = 0; /* 0 for errors */
  else
    /* make the pointer point to something for the rest of this function */
    ftpcode = &value_to_be_ignored;

  *nreadp=0;

  while(!*ftpcode && !result) {
    /* check and reset timeout value every lap */
    timeout = Curl_pp_state_timeout(pp);

    if(timeout <=0 ) {
      failf(data, "FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT; /* already too little time */
    }

    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout < interval_ms)
      interval_ms = timeout;

    /*
     * Since this function is blocking, we need to wait here for input on the
     * connection and only then we call the response reading function. We do
     * timeout at least every second to make the timeout check run.
     *
     * A caution here is that the ftp_readresp() function has a cache that may
     * contain pieces of a response from the previous invoke and we need to
     * make sure we don't just wait for input while there is unhandled data in
     * that cache. But also, if the cache is there, we call ftp_readresp() and
     * the cache wasn't good enough to continue we must not just busy-loop
     * around this function.
     *
     */

    if(pp->cache && (cache_skip < 2)) {
      /*
       * There's a cache left since before. We then skipping the wait for
       * socket action, unless this is the same cache like the previous round
       * as then the cache was deemed not enough to act on and we then need to
       * wait for more data anyway.
       */
    }
    else {
      switch (Curl_socket_ready(sockfd, CURL_SOCKET_BAD, interval_ms)) {
      case -1: /* select() error, stop reading */
        failf(data, "FTP response aborted due to select/poll error: %d",
              SOCKERRNO);
        return CURLE_RECV_ERROR;

      case 0: /* timeout */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
        continue; /* just continue in our loop for the timeout duration */

      default: /* for clarity */
        break;
      }
    }
    result = ftp_readresp(sockfd, pp, ftpcode, &nread);
    if(result)
      break;

    if(!nread && pp->cache)
      /* bump cache skip counter as on repeated skips we must wait for more
         data */
      cache_skip++;
    else
      /* when we got data or there is no cache left, we reset the cache skip
         counter */
      cache_skip=0;

    *nreadp += nread;

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}